

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result_opt * __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::next(iter_result_opt *__return_storage_ptr__,
      basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      *this,uint8_t child_index)

{
  byte bVar1;
  key_prefix_snapshot kVar2;
  uintptr_t uVar3;
  byte bVar4;
  undefined4 local_2e;
  undefined2 local_2a;
  
  bVar4 = child_index + 1;
  if (bVar4 < (byte)this->field_0x20) {
    bVar1 = *(byte *)((long)(this->children)._M_elems + ((ulong)bVar4 - 4));
    uVar3 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr((olc_node_header *)this,I4);
    kVar2 = *(key_prefix_snapshot *)&this->field_0x18;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.node.tagged_ptr = uVar3;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.key_byte = bVar1;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.child_index = bVar4;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 10) = local_2e;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 0xe) = local_2a;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.prefix = kVar2;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_engaged = true;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.node.tagged_ptr = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 8) = 0;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.prefix.u64 = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_4::iter_result_opt
  next(std::uint8_t child_index) noexcept {
    const auto nchildren{this->children_count.load()};
    const auto next_index{static_cast<uint8_t>(child_index + 1)};
    if (next_index >= nchildren) return parent_class::end_result;
    const auto key = keys.byte_array[next_index].load();
    return {{node_ptr{this, node_type::I4}, key, next_index,
             this->get_key_prefix().get_snapshot()}};
  }